

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateMergingCode
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  LogMessage *other;
  char *text;
  LogFinisher local_51;
  LogMessage local_50;
  
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) == 0) ||
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 == (Descriptor *)0x0 &&
        (((byte)this_00[1] & 2) == 0)) && (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) != '\x02'))
      && ((lVar1 = *(long *)(this_00 + 0x28), lVar1 == 0 || ((byte)this_00[1] & 0x10) == 0 ||
          ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))))) {
    if (*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) != '\x03') {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field.cc"
                 ,0x153);
      other = internal::LogMessage::operator<<(&local_50,"Can\'t reach here.");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
      return;
    }
    text = 
    "if (other.$name$_ != $default_number$) {\n  set$capitalized_name$Value(other.get$capitalized_name$Value());\n}\n"
    ;
  }
  else {
    text = 
    "if (other.has$capitalized_name$()) {\n  set$capitalized_name$(other.get$capitalized_name$());\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    printer->Print(variables_,
                   "if (other.has$capitalized_name$()) {\n"
                   "  set$capitalized_name$(other.get$capitalized_name$());\n"
                   "}\n");
  } else if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(
        variables_,
        "if (other.$name$_ != $default_number$) {\n"
        "  set$capitalized_name$Value(other.get$capitalized_name$Value());\n"
        "}\n");
  } else {
    GOOGLE_LOG(FATAL) << "Can't reach here.";
  }
}